

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiout.cpp
# Opt level: O2

bool chooseMidiPort(RtMidiOut *rtmidi)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  uint local_98;
  allocator<char> local_91;
  allocator<char> local_90 [32];
  string portName;
  string keyHit;
  
  std::operator<<((ostream *)&std::cout,"\nWould you like to open a virtual output port? [y/N] ");
  keyHit._M_dataplus._M_p = (pointer)&keyHit.field_2;
  keyHit._M_string_length = 0;
  keyHit.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&keyHit);
  bVar1 = std::operator==(&keyHit,"y");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&portName,"RtMidi Output",local_90)
    ;
    (**(code **)(*(long *)rtmidi + 8))(rtmidi,&portName);
    std::__cxx11::string::~string((string *)&portName);
    bVar1 = true;
  }
  else {
    portName._M_dataplus._M_p = (pointer)&portName.field_2;
    portName._M_string_length = 0;
    portName.field_2._M_local_buf[0] = '\0';
    local_98 = 0;
    uVar2 = (**(code **)(*(long *)rtmidi + 0x10))(rtmidi);
    bVar1 = uVar2 != 0;
    if (uVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No output ports available!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      if (uVar2 == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\nOpening ");
        (**(code **)(*(long *)rtmidi + 0x18))(local_90,rtmidi,0);
        poVar3 = std::operator<<(poVar3,(string *)local_90);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)local_90);
      }
      else {
        for (local_98 = 0; local_98 < uVar2; local_98 = local_98 + 1) {
          (**(code **)(*(long *)rtmidi + 0x18))((string *)local_90,rtmidi,local_98);
          std::__cxx11::string::operator=((string *)&portName,(string *)local_90);
          std::__cxx11::string::~string((string *)local_90);
          poVar3 = std::operator<<((ostream *)&std::cout,"  Output port #");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = std::operator<<(poVar3,(string *)&portName);
          std::operator<<(poVar3,'\n');
        }
        do {
          std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
          std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
        } while (uVar2 <= local_98);
      }
      std::operator<<((ostream *)&std::cout,"\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,"RtMidi Output",&local_91);
      (*(code *)**(undefined8 **)rtmidi)(rtmidi,local_98,local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
    std::__cxx11::string::~string((string *)&portName);
  }
  std::__cxx11::string::~string((string *)&keyHit);
  return bVar1;
}

Assistant:

bool chooseMidiPort( RtMidiOut *rtmidi )
{
  std::cout << "\nWould you like to open a virtual output port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No output ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  Output port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << "\n";
  rtmidi->openPort( i );

  return true;
}